

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

bool Grammar::is_dictionary_type(string *str)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  string types_of_dictionary;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&types_of_dictionary,"Dictionary<",(allocator *)&local_80);
  bVar1 = str_utils::starts_with(str,&types_of_dictionary);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_a0,">",(allocator *)&local_40);
    bVar1 = str_utils::ends_with(str,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&types_of_dictionary);
    uVar3 = 0;
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&types_of_dictionary,(ulong)str);
      uVar2 = 0;
      if (0 < (int)types_of_dictionary._M_string_length) {
        uVar2 = types_of_dictionary._M_string_length & 0xffffffff;
      }
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        if (types_of_dictionary._M_dataplus._M_p[uVar3] == ',') {
          std::__cxx11::string::substr((ulong)&local_80,(ulong)&types_of_dictionary);
          str_utils::trim(&local_a0,&local_80);
          bVar1 = is_object_type(&local_a0);
          if (bVar1) {
            std::__cxx11::string::substr((ulong)&local_60,(ulong)&types_of_dictionary);
            str_utils::trim(&local_40,&local_60);
            bVar1 = is_object_type(&local_40);
            std::__cxx11::string::~string((string *)&local_40);
            std::__cxx11::string::~string((string *)&local_60);
          }
          else {
            bVar1 = false;
          }
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_80);
          break;
        }
      }
      uVar3 = (ulong)(byte)((long)uVar3 < (long)(int)types_of_dictionary._M_string_length & bVar1);
      std::__cxx11::string::~string((string *)&types_of_dictionary);
    }
  }
  else {
    std::__cxx11::string::~string((string *)&types_of_dictionary);
    uVar3 = 0;
  }
  return SUB81(uVar3,0);
}

Assistant:

bool Grammar::is_dictionary_type(const std::string& str) {
    if (!str_utils::starts_with(str, "Dictionary<") || !str_utils::ends_with(str, ">"))
        return false;
    std::string types_of_dictionary = str.substr(11, int(str.size()) - 12);
    for (int i = 0; i < int(types_of_dictionary.size()); i++)
        if (types_of_dictionary[i] == ',')
            return is_object_type(str_utils::trim(types_of_dictionary.substr(0, i))) &&
                   is_object_type(str_utils::trim(types_of_dictionary.substr(i + 1)));
    return false;
}